

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O0

void render_url_escaped(MD_HTML *r,MD_CHAR *data,MD_SIZE size)

{
  uint uVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  char hex [3];
  MD_OFFSET off;
  MD_OFFSET beg;
  MD_CHAR *in_stack_ffffffffffffffd8;
  byte bVar2;
  undefined1 in_stack_ffffffffffffffe1;
  MD_CHAR in_stack_ffffffffffffffe2;
  MD_CHAR in_stack_ffffffffffffffe3;
  uint local_18;
  
  local_18 = 0;
  uVar1 = local_18;
  while( true ) {
    while( true ) {
      bVar2 = 0;
      if (uVar1 < in_EDX) {
        bVar2 = (*(byte *)(in_RDI + 0x18 + (ulong)*(byte *)(in_RSI + (ulong)uVar1)) & 2) != 0 ^ 0xff
        ;
      }
      if ((bVar2 & 1) == 0) break;
      uVar1 = uVar1 + 1;
    }
    if (local_18 < uVar1) {
      render_verbatim((MD_HTML *)
                      CONCAT44(uVar1,CONCAT13(in_stack_ffffffffffffffe3,
                                              CONCAT12(in_stack_ffffffffffffffe2,
                                                       CONCAT11(in_stack_ffffffffffffffe1,bVar2)))),
                      in_stack_ffffffffffffffd8,0);
    }
    if (in_EDX <= uVar1) break;
    if (*(char *)(in_RSI + (ulong)uVar1) == '&') {
      render_verbatim((MD_HTML *)
                      CONCAT44(uVar1,CONCAT13(in_stack_ffffffffffffffe3,
                                              CONCAT12(in_stack_ffffffffffffffe2,
                                                       CONCAT11(in_stack_ffffffffffffffe1,bVar2)))),
                      in_stack_ffffffffffffffd8,0);
    }
    else {
      in_stack_ffffffffffffffe1 = 0x25;
      in_stack_ffffffffffffffe2 =
           "0123456789ABCDEF"[(uint)(int)*(char *)(in_RSI + (ulong)uVar1) >> 4 & 0xf];
      in_stack_ffffffffffffffe3 = "0123456789ABCDEF"[(int)*(char *)(in_RSI + (ulong)uVar1) & 0xf];
      render_verbatim((MD_HTML *)
                      CONCAT44(uVar1,CONCAT13(in_stack_ffffffffffffffe3,
                                              CONCAT12(in_stack_ffffffffffffffe2,
                                                       CONCAT11(0x25,bVar2)))),
                      in_stack_ffffffffffffffd8,0);
    }
    uVar1 = uVar1 + 1;
    local_18 = uVar1;
  }
  return;
}

Assistant:

static void
render_url_escaped(MD_HTML* r, const MD_CHAR* data, MD_SIZE size)
{
    static const MD_CHAR hex_chars[] = "0123456789ABCDEF";
    MD_OFFSET beg = 0;
    MD_OFFSET off = 0;

    /* Some characters need to be escaped in URL attributes. */
    #define NEED_URL_ESC(ch)    (r->escape_map[(unsigned char)(ch)] & NEED_URL_ESC_FLAG)

    while(1) {
        while(off < size  &&  !NEED_URL_ESC(data[off]))
            off++;
        if(off > beg)
            render_verbatim(r, data + beg, off - beg);

        if(off < size) {
            char hex[3];

            switch(data[off]) {
                case '&':   RENDER_VERBATIM(r, "&amp;"); break;
                default:
                    hex[0] = '%';
                    hex[1] = hex_chars[((unsigned)data[off] >> 4) & 0xf];
                    hex[2] = hex_chars[((unsigned)data[off] >> 0) & 0xf];
                    render_verbatim(r, hex, 3);
                    break;
            }
            off++;
        } else {
            break;
        }

        beg = off;
    }
}